

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

void __thiscall
kj::_::HeapDisposer<capnp::LocalRequest>::disposeImpl
          (HeapDisposer<capnp::LocalRequest> *this,void *pointer)

{
  if (pointer != (void *)0x0) {
    capnp::LocalRequest::~LocalRequest((LocalRequest *)pointer);
  }
  operator_delete(pointer,0x38);
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }